

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

void __thiscall
c4::yml::Parser::_err<c4::basic_substring<char_const>>
          (Parser *this,csubstr fmt,basic_substring<const_char> *args)

{
  size_t sVar1;
  basic_substring<const_char> *in_R8;
  csubstr fmt_00;
  anon_class_8_1_72ac95b1 dumpfn;
  _SubstrWriter writer;
  char errmsg [1024];
  anon_class_8_1_72ac95b1 local_438;
  _SubstrWriter local_430;
  char local_418 [1032];
  
  fmt_00.str = (char *)fmt.len;
  local_430.buf.str = local_418;
  local_438.writer = &local_430;
  local_430.buf.len = 0x3ff;
  local_430.pos = 0;
  fmt_00.len = (size_t)args;
  (anonymous_namespace)::
  _parse_dump<c4::yml::Parser::_err<c4::basic_substring<char_const>>(c4::basic_substring<char_const>,c4::basic_substring<char_const>const&restrict)const::_lambda(c4::basic_substring<char_const>)_1_,c4::basic_substring<char_const>const&>
            ((_anonymous_namespace_ *)local_438.writer,(_SubstrWriter *)fmt.str,fmt_00,in_R8);
  if (local_430.pos < local_430.buf.len) {
    local_430.buf.str[local_430.pos] = '\n';
  }
  local_430.pos = local_430.pos + 1;
  _fmt_msg<c4::yml::Parser::_err<c4::basic_substring<char_const>>(c4::basic_substring<char_const>,c4::basic_substring<char_const>const&restrict)const::_lambda(c4::basic_substring<char_const>)_1_&>
            (this,&local_438);
  sVar1 = 0x400;
  if (local_430.pos < 0x400) {
    sVar1 = local_430.pos;
  }
  (*(this->m_tree->m_callbacks).m_error)
            (local_418,sVar1,this->m_state->pos,(this->m_tree->m_callbacks).m_user_data);
  return;
}

Assistant:

void Parser::_err(csubstr fmt, Args const& C4_RESTRICT ...args) const
{
    char errmsg[RYML_ERRMSG_SIZE];
    detail::_SubstrWriter writer(errmsg);
    auto dumpfn = [&writer](csubstr s){ writer.append(s); };
    _parse_dump(dumpfn, fmt, args...);
    writer.append('\n');
    _fmt_msg(dumpfn);
    size_t len = writer.pos < RYML_ERRMSG_SIZE ? writer.pos : RYML_ERRMSG_SIZE;
    m_tree->m_callbacks.m_error(errmsg, len, m_state->pos, m_tree->m_callbacks.m_user_data);
}